

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O2

bool __thiscall mpt::encode_array::prepare(encode_array *this,size_t len)

{
  content *pcVar1;
  void *pvVar2;
  size_t len_00;
  bool bVar3;
  
  if (this->_enc == (data_encoder_t)0x0) {
    pcVar1 = (this->_d)._buf._ref;
    if ((pcVar1 == (content *)0x0) || (*(long *)(pcVar1 + 8) != 0)) {
      len_00 = 0;
    }
    else {
      len_00 = *(size_t *)(pcVar1 + 0x18);
    }
    bVar3 = false;
    pvVar2 = array::set(&this->_d,len + len_00,(void *)0x0);
    if (pvVar2 != (void *)0x0) {
      array::set(&this->_d,len_00,(void *)0x0);
      bVar3 = true;
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool encode_array::prepare(size_t len)
{
	if (_enc) {
		return false;
	}
	size_t old = _d.length();
	if (!_d.set(old + len)) {
		return false;
	}
	_d.set(old);
	return true;
}